

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::cmCTestLaunch(cmCTestLaunch *this,int argc,char **argv)

{
  bool bVar1;
  cmsysProcess *pcVar2;
  bool collapse;
  string local_40;
  char **local_20;
  char **argv_local;
  cmCTestLaunch *pcStack_10;
  int argc_local;
  cmCTestLaunch *this_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pcStack_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->OptionSource);
  std::__cxx11::string::string((string *)&this->OptionLanguage);
  std::__cxx11::string::string((string *)&this->OptionTargetName);
  std::__cxx11::string::string((string *)&this->OptionTargetType);
  std::__cxx11::string::string((string *)&this->OptionBuildDir);
  std::__cxx11::string::string((string *)&this->OptionFilterPrefix);
  std::__cxx11::string::string((string *)&this->CWD);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RealArgs);
  std::__cxx11::string::string((string *)&this->LogHash);
  std::__cxx11::string::string((string *)&this->LogDir);
  std::__cxx11::string::string((string *)&this->LogOut);
  std::__cxx11::string::string((string *)&this->LogErr);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Labels);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->RegexWarning);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->RegexWarningSuppress);
  std::__cxx11::string::string((string *)&this->SourceDir);
  this->Passthru = true;
  this->Process = (cmsysProcess_s *)0x0;
  this->ExitCode = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_40,(SystemTools *)0x1,collapse);
  std::__cxx11::string::operator=((string *)&this->CWD,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = ParseArguments(this,argv_local._4_4_,local_20);
  if (bVar1) {
    ComputeFileNames(this);
    this->ScrapeRulesLoaded = false;
    this->HaveOut = false;
    this->HaveErr = false;
    pcVar2 = cmsysProcess_New();
    this->Process = pcVar2;
  }
  return;
}

Assistant:

cmCTestLaunch::cmCTestLaunch(int argc, const char* const* argv)
{
  this->Passthru = true;
  this->Process = CM_NULLPTR;
  this->ExitCode = 1;
  this->CWD = cmSystemTools::GetCurrentWorkingDirectory();

  if (!this->ParseArguments(argc, argv)) {
    return;
  }

  this->ComputeFileNames();

  this->ScrapeRulesLoaded = false;
  this->HaveOut = false;
  this->HaveErr = false;
  this->Process = cmsysProcess_New();
}